

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void array_suite::test_string(void)

{
  string *this;
  iterator iVar1;
  iterator iVar2;
  undefined7 uStack_120;
  undefined1 uStack_119;
  output_type expected [11];
  undefined1 local_108 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  expected[5] = '\x01';
  unique0x1000020f = (string *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"AB",(allocator<char> *)(expected + 7));
  this = (string *)(value._M_elems[0].field_2._M_local_buf + 8);
  unique0x10000217 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,"CD",(allocator<char> *)(expected + 6));
  expected[5] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(expected + 6));
  std::allocator<char>::~allocator((allocator<char> *)(expected + 7));
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_108);
  uStack_120 = 0xa9424102a90292;
  _uStack_119 = 0x93444302;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x38,"void array_suite::test_string()",iVar1._M_current,iVar2._M_current,&uStack_120,
             expected + 3);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)local_108);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_string()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::array<std::string, 2> value = {{ "AB", "CD" }};
    ar << value;

    const output_type expected[] = { token::code::begin_array,
                                     0x02,
                                     token::code::string8, 0x02, 0x41, 0x42,
                                     token::code::string8, 0x02, 0x43, 0x44,
                                     token::code::end_array };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}